

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall libtorrent::dht::node::update_node_id(node *this)

{
  bool bVar1;
  node_id local_44;
  undefined1 local_30 [8];
  address ext_address;
  node *this_local;
  
  if (this->m_observer != (dht_observer *)0x0) {
    ext_address.ipv6_address_.scope_id_ = (unsigned_long)this;
    libtorrent::aux::listen_socket_handle::get_external_address((address *)local_30,&this->m_sock);
    bVar1 = verify_id(&this->m_id,(address *)local_30);
    if (!bVar1) {
      if (this->m_observer != (dht_observer *)0x0) {
        (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
                  (this->m_observer,1,"updating node ID (because external IP address changed)");
      }
      generate_id(&local_44,(address *)local_30);
      *(undefined8 *)(this->m_id).m_number._M_elems = local_44.m_number._M_elems._0_8_;
      *(undefined8 *)((this->m_id).m_number._M_elems + 2) = local_44.m_number._M_elems._8_8_;
      (this->m_id).m_number._M_elems[4] = local_44.m_number._M_elems[4];
      routing_table::update_node_id(&this->m_table,&this->m_id);
      rpc_manager::update_node_id(&this->m_rpc,&this->m_id);
    }
  }
  return;
}

Assistant:

void node::update_node_id()
{
	// if we don't have an observer, we can't ask for the external IP (and our
	// current node ID is likely not generated from an external address), so we
	// can just stop here in that case.
	if (m_observer == nullptr) return;

	auto ext_address = m_sock.get_external_address();

	// it's possible that our external address hasn't actually changed. If our
	// current ID is still valid, don't do anything.
	if (verify_id(m_id, ext_address))
		return;

#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr) m_observer->log(dht_logger::node
		, "updating node ID (because external IP address changed)");
#endif

	m_id = generate_id(ext_address);

	m_table.update_node_id(m_id);
	m_rpc.update_node_id(m_id);
}